

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcZShapeProfileDef::IfcZShapeProfileDef(IfcZShapeProfileDef *this)

{
  *(undefined ***)&this->field_0xc0 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0xc8 = 0;
  *(char **)&this->field_0xd0 = "IfcZShapeProfileDef";
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,&PTR_construction_vtable_24__007bb418);
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x78 = 0;
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x7bb388;
  *(undefined8 *)&this->field_0xc0 = 0x7bb400;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = 0x7bb3b0
  ;
  *(undefined8 *)&(this->super_IfcParameterizedProfileDef).field_0x70 = 0x7bb3d8;
  (this->FilletRadius).have = false;
  (this->EdgeRadius).have = false;
  return;
}

Assistant:

IfcZShapeProfileDef() : Object("IfcZShapeProfileDef") {}